

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O1

PSNodeJoin * __thiscall
dg::pta::LLVMPointerGraphBuilder::createJoinNode
          (LLVMPointerGraphBuilder *this,CallInst *CInst,PSNode *callNode)

{
  iterator __position;
  PSNodeJoin *pPVar1;
  PSNodeJoin *joinNode;
  PSNodeJoin *local_20;
  
  pPVar1 = (PSNodeJoin *)PointerGraph::create<(dg::pta::PSNodeType)14>((PointerGraph *)this);
  local_20 = (PSNodeJoin *)0x0;
  if ((pPVar1->super_PSNode).type == JOIN) {
    local_20 = pPVar1;
  }
  callNode->pairedNode = &local_20->super_PSNode;
  (local_20->super_PSNode).pairedNode = callNode;
  local_20->callInstruction = callNode;
  __position._M_current = *(PSNodeJoin ***)(this + 0x218);
  if (__position._M_current == *(PSNodeJoin ***)(this + 0x220)) {
    std::vector<dg::pta::PSNodeJoin*,std::allocator<dg::pta::PSNodeJoin*>>::
    _M_realloc_insert<dg::pta::PSNodeJoin*const&>
              ((vector<dg::pta::PSNodeJoin*,std::allocator<dg::pta::PSNodeJoin*>> *)(this + 0x210),
               __position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    *(long *)(this + 0x218) = *(long *)(this + 0x218) + 8;
  }
  addArgumentOperands(this,CInst,callNode);
  return local_20;
}

Assistant:

PSNodeJoin *LLVMPointerGraphBuilder::createJoinNode(const llvm::CallInst *CInst,
                                                    PSNode *callNode) {
    using namespace llvm;

    PSNodeJoin *joinNode = PSNodeJoin::get(PS.create<PSNodeType::JOIN>());
    callNode->setPairedNode(joinNode);
    joinNode->setPairedNode(callNode);

    joinNode->setCallInst(callNode);

    joinNodes.push_back(joinNode);
    addArgumentOperands(*CInst, *callNode);

    return joinNode;
}